

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void wasm::ABI::getStackSpace(Index local,Function *func,Index size,Module *wasm)

{
  string_view name;
  Index index;
  Expression *this;
  Function *func_00;
  bool bVar1;
  reference this_00;
  pointer pMVar2;
  GlobalGet *left;
  Const *right;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar3;
  LocalSet *pLVar4;
  GlobalSet *pGVar5;
  reference pppEVar6;
  ExpressionList *pEVar7;
  Return *pRVar8;
  Block *pBVar9;
  LocalGet *pLVar10;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type;
  bool local_329;
  undefined1 local_308 [12];
  uintptr_t local_2f8;
  uintptr_t local_2f0;
  Index local_2e8;
  BasicType local_2e4;
  Index temp_1;
  undefined1 local_2d8 [2] [12];
  undefined1 local_2c0 [12];
  uintptr_t local_2b0;
  uintptr_t local_2a8;
  Index local_29c;
  Block *pBStack_298;
  Index temp;
  Block *block_1;
  Return *local_288;
  Return *ret;
  Expression **ptr;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2;
  FindAllPointers<wasm::Return> finder;
  anon_class_40_5_8eb904dd makeStackRestore;
  BasicType local_1ec;
  Binary *local_1e8;
  Expression *added;
  Block *block;
  Builder builder;
  Type pointerType;
  Fatal local_1b8;
  Global *local_30;
  Global *stackPointer;
  Module *wasm_local;
  Function *pFStack_18;
  Index size_local;
  Function *func_local;
  Index local_local;
  
  stackPointer = (Global *)wasm;
  wasm_local._4_4_ = size;
  pFStack_18 = func;
  func_local._4_4_ = local;
  local_30 = getStackPointerGlobal(wasm);
  if (local_30 == (Global *)0x0) {
    Fatal::Fatal(&local_1b8);
    Fatal::operator<<(&local_1b8,(char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal(&local_1b8);
  }
  wasm_local._4_4_ = stackAlign(wasm_local._4_4_);
  bVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   *)&stackPointer[1].super_Importable.base);
  if (bVar1) {
    wasm::Type::Type((Type *)&builder,i32);
  }
  else {
    this_00 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                            *)&stackPointer[1].super_Importable.base,0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
    builder.wasm = (Module *)(pMVar2->addressType).id;
  }
  Builder::Builder((Builder *)&block,(Module *)stackPointer);
  added = (Expression *)Builder::makeBlock((Builder *)&block,(Expression *)0x0);
  local_1ec = i32;
  bVar1 = wasm::Type::operator==((Type *)&builder,&local_1ec);
  if (bVar1) {
    left = Builder::makeGlobalGet
                     ((Builder *)&block,
                      (Name)(local_30->super_Importable).super_Named.name.super_IString.str,
                      (Type)builder.wasm);
    right = Builder::makeConst<int>((Builder *)&block,wasm_local._4_4_);
    local_1e8 = Builder::makeBinary((Builder *)&block,SubInt32,(Expression *)left,
                                    (Expression *)right);
    pAVar3 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(added + 2);
    name = (local_30->super_Importable).super_Named.name.super_IString.str;
    pLVar4 = Builder::makeLocalTee
                       ((Builder *)&block,func_local._4_4_,(Expression *)local_1e8,
                        (Type)builder.wasm);
    pGVar5 = Builder::makeGlobalSet((Builder *)&block,(Name)name,(Expression *)pLVar4);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (pAVar3,(Expression *)pGVar5);
    finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&block;
    FindAllPointers<wasm::Return>::FindAllPointers
              ((FindAllPointers<wasm::Return> *)&__range2,&pFStack_18->body);
    __end2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                       ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        &__range2);
    ptr = (Expression **)
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                    ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)&__range2)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                       *)&ptr), bVar1) {
      pppEVar6 = __gnu_cxx::
                 __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                 ::operator*(&__end2);
      ret = (Return *)*pppEVar6;
      local_288 = Expression::cast<wasm::Return>
                            (*(Expression **)
                              &(ret->super_SpecificExpression<(wasm::Expression::Id)19>).
                               super_Expression);
      local_329 = false;
      if (local_288->value != (Expression *)0x0) {
        block_1._4_4_ = 1;
        local_329 = wasm::Type::operator!=
                              (&local_288->value->type,(BasicType *)((long)&block_1 + 4));
      }
      if (local_329 == false) {
        pGVar5 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                           ((anon_class_40_5_8eb904dd *)
                            &finder.list.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pRVar8 = local_288;
        std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_2d8);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_2d8[0]._0_8_;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2d8[0][8];
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_2d8[0]._9_3_;
        pBVar9 = Builder::makeSequence
                           ((Builder *)&block,(Expression *)pGVar5,(Expression *)pRVar8,type);
        *(Block **)&(ret->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression =
             pBVar9;
      }
      else {
        pBStack_298 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
        local_2a8 = (local_288->value->type).id;
        local_29c = Builder::addVar(pFStack_18,(Type)local_2a8);
        pEVar7 = &pBStack_298->list;
        pLVar4 = Builder::makeLocalSet((Builder *)&block,local_29c,local_288->value);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar4);
        pEVar7 = &pBStack_298->list;
        pGVar5 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                           ((anon_class_40_5_8eb904dd *)
                            &finder.list.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pGVar5);
        pEVar7 = &pBStack_298->list;
        local_2b0 = (local_288->value->type).id;
        pLVar10 = Builder::makeLocalGet((Builder *)&block,local_29c,(Type)local_2b0);
        pRVar8 = Builder::makeReturn((Builder *)&block,(Expression *)pLVar10);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pRVar8);
        pBVar9 = pBStack_298;
        std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_2c0);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_2c0._0_8_;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2c0[8];
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_2c0._9_3_;
        Block::finalize(pBVar9,type_,Unknown);
        *(Block **)&(ret->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression =
             pBStack_298;
      }
      __gnu_cxx::
      __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
      ::operator++(&__end2);
    }
    temp_1 = 0;
    bVar1 = wasm::Type::operator==(&pFStack_18->body->type,&temp_1);
    if (bVar1) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(added + 2)
                 ,pFStack_18->body);
      pAVar3 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(added + 2);
      pGVar5 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                         ((anon_class_40_5_8eb904dd *)
                          &finder.list.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (pAVar3,(Expression *)pGVar5);
    }
    else {
      local_2e4 = unreachable;
      bVar1 = wasm::Type::operator==(&pFStack_18->body->type,&local_2e4);
      func_00 = pFStack_18;
      if (bVar1) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   (added + 2),pFStack_18->body);
      }
      else {
        local_2f0 = (uintptr_t)Function::getResults(pFStack_18);
        local_2e8 = Builder::addVar(func_00,(Type)local_2f0);
        pAVar3 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(added + 2)
        ;
        pLVar4 = Builder::makeLocalSet((Builder *)&block,local_2e8,pFStack_18->body);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (pAVar3,(Expression *)pLVar4);
        pAVar3 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(added + 2)
        ;
        pGVar5 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                           ((anon_class_40_5_8eb904dd *)
                            &finder.list.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (pAVar3,(Expression *)pGVar5);
        index = local_2e8;
        pAVar3 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(added + 2)
        ;
        local_2f8 = (uintptr_t)Function::getResults(pFStack_18);
        pLVar10 = Builder::makeLocalGet((Builder *)&block,index,(Type)local_2f8);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (pAVar3,(Expression *)pLVar10);
      }
    }
    this = added;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_308);
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_308._0_8_;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_308[8];
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_308._9_3_;
    Block::finalize((Block *)this,type__00,Unknown);
    pFStack_18->body = added;
    FindAllPointers<wasm::Return>::~FindAllPointers((FindAllPointers<wasm::Return> *)&__range2);
    return;
  }
  handle_unreachable("unhandled pointerType",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/abi/stack.h"
                     ,0x40);
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->addressType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added =
      builder.makeBinary(SubInt32,
                         builder.makeGlobalGet(stackPointer->name, pointerType),
                         builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(
    stackPointer->name, builder.makeLocalTee(local, added, pointerType)));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(
      stackPointer->name,
      builder.makeBinary(AddInt32,
                         builder.makeLocalGet(local, pointerType),
                         builder.makeConst(int32_t(size))));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}